

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t_const*,std::__cxx11::wstring>,wchar_t>
          (pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          begin,__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                end,wchar_t in_delim)

{
  bool bVar1;
  reference pwVar2;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  in_itr;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar3;
  size_t local_a0;
  wchar_t *local_98;
  size_t local_80;
  wchar_t *local_78;
  size_t local_60;
  wchar_t *local_58;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_50;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  itr;
  undefined1 local_40 [8];
  pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
  result;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_18;
  wchar_t in_delim_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  end_local;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  begin_local;
  
  result.second._M_str._4_4_ = (wchar_t)end._M_current;
  _Stack_18._M_current = begin._M_current;
  end_local._M_current = (wchar_t *)this;
  std::
  pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
  ::
  pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_true>
            ((pair<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>
              *)local_40);
  itr._M_current._7_1_ =
       __gnu_cxx::operator<=><wchar_t_const*,std::__cxx11::wstring>
                 (&end_local,&stack0xffffffffffffffe8);
  std::__cmp_cat::__unspec::__unspec((__unspec *)((long)&itr._M_current + 6),(__unspec *)0x0);
  bVar1 = std::operator>=(itr._M_current._7_1_);
  if (bVar1) {
    (__return_storage_ptr__->first)._M_len = (size_t)local_40;
    (__return_storage_ptr__->first)._M_str = (wchar_t *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (wchar_t *)result.second._M_len;
  }
  else {
    local_50._M_current = end_local._M_current;
    while (bVar1 = __gnu_cxx::
                   operator==<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                             (&local_50,&stack0xffffffffffffffe8), ((bVar1 ^ 0xffU) & 1) != 0) {
      pwVar2 = __gnu_cxx::
               __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               ::operator*(&local_50);
      if (*pwVar2 == result.second._M_str._4_4_) {
        bVar3 = make_split_member<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
                          (end_local,local_50);
        local_60 = bVar3._M_len;
        local_40 = (undefined1  [8])local_60;
        local_58 = bVar3._M_str;
        result.first._M_len = (size_t)local_58;
        in_itr = __gnu_cxx::
                 __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 ::operator+(&local_50,1);
        bVar3 = make_split_member<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
                          (in_itr,_Stack_18);
        local_80 = bVar3._M_len;
        local_78 = bVar3._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)local_40;
        (__return_storage_ptr__->first)._M_str = (wchar_t *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_80;
        (__return_storage_ptr__->second)._M_str = local_78;
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator++(&local_50);
    }
    bVar3 = make_split_member<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,___gnu_cxx::__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_nullptr>
                      (end_local,_Stack_18);
    local_a0 = bVar3._M_len;
    local_98 = bVar3._M_str;
    (__return_storage_ptr__->first)._M_len = local_a0;
    (__return_storage_ptr__->first)._M_str = local_98;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (wchar_t *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}